

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::Promise<unsigned_long>_> * __thiscall
kj::anon_unknown_31::PromiseOutputStream::tryPumpFrom
          (Maybe<kj::Promise<unsigned_long>_> *__return_storage_ptr__,PromiseOutputStream *this,
          AsyncInputStream *input,uint64_t amount)

{
  AsyncOutputStream *pAVar1;
  PromiseOutputStream *local_68;
  uint64_t local_60;
  Own<kj::AsyncOutputStream> *local_58;
  undefined1 local_50 [32];
  Own<kj::AsyncOutputStream> *local_30;
  Own<kj::AsyncOutputStream> *s;
  uint64_t amount_local;
  AsyncInputStream *input_local;
  PromiseOutputStream *this_local;
  
  s = (Own<kj::AsyncOutputStream> *)amount;
  amount_local = (uint64_t)input;
  input_local = (AsyncInputStream *)this;
  this_local = (PromiseOutputStream *)__return_storage_ptr__;
  local_30 = _::readMaybe<kj::AsyncOutputStream>(&this->stream);
  if (local_30 == (Own<kj::AsyncOutputStream> *)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_50);
    local_60 = amount_local;
    local_58 = s;
    local_68 = this;
    Promise<void>::
    then<kj::(anonymous_namespace)::PromiseOutputStream::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda()_1_,kj::_::PropagateException>
              ((Promise<void> *)(local_50 + 0x10),(Type *)local_50,(PropagateException *)&local_68);
    Maybe<kj::Promise<unsigned_long>_>::Maybe
              (__return_storage_ptr__,(Promise<unsigned_long> *)(local_50 + 0x10));
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)(local_50 + 0x10));
    Promise<void>::~Promise((Promise<void> *)local_50);
  }
  else {
    pAVar1 = Own<kj::AsyncOutputStream>::get(local_30);
    (*pAVar1->_vptr_AsyncOutputStream[2])(__return_storage_ptr__,pAVar1,amount_local,s);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> tryPumpFrom(
      kj::AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
    KJ_IF_MAYBE(s, stream) {
      return s->get()->tryPumpFrom(input, amount);
    } else {
      return promise.addBranch().then([this,&input,amount]() {
        // Call input.pumpTo() on the resolved stream instead.
        return input.pumpTo(*KJ_ASSERT_NONNULL(stream), amount);
      });
    }
  }